

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

WalletTx * __thiscall
wallet::anon_unknown_5::WalletImpl::getWalletTx
          (WalletTx *__return_storage_ptr__,WalletImpl *this,uint256 *txid)

{
  _Rb_tree_header *p_Var1;
  iterator iVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock21;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_30,
             &((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->cs_wallet,"m_wallet->cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/interfaces.cpp"
             ,0x156,false);
  iVar2 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->mapWallet)._M_h,txid);
  if (iVar2.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur ==
      (__node_type *)0x0) {
    p_Var1 = &(__return_storage_ptr__->value_map)._M_t._M_impl.super__Rb_tree_header;
    memset(__return_storage_ptr__,0,0xd0);
    (__return_storage_ptr__->value_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->value_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->value_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __return_storage_ptr__->is_coinbase = false;
  }
  else {
    MakeWalletTx(__return_storage_ptr__,
                 (this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(CWalletTx *)
                        ((long)iVar2.
                               super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                               ._M_cur + 0x28));
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

WalletTx getWalletTx(const uint256& txid) override
    {
        LOCK(m_wallet->cs_wallet);
        auto mi = m_wallet->mapWallet.find(txid);
        if (mi != m_wallet->mapWallet.end()) {
            return MakeWalletTx(*m_wallet, mi->second);
        }
        return {};
    }